

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O2

string * __thiscall
OpenMD::SelectionCompiler::getUnescapedStringLiteral_abi_cxx11_
          (string *__return_storage_ptr__,SelectionCompiler *this)

{
  pointer pcVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  SelectionCompiler *this_00;
  ulong uVar7;
  
  iVar3 = this->cchToken;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  this_00 = (SelectionCompiler *)__return_storage_ptr__;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)iVar3 + -2);
  iVar6 = this->ichToken + this->cchToken + -1;
  iVar3 = this->ichToken + 1;
  do {
    if (iVar6 <= iVar3) {
      return __return_storage_ptr__;
    }
    pcVar1 = (this->script)._M_dataplus._M_p;
    uVar7 = (long)iVar3 + 1;
    if ((pcVar1[iVar3] == '\\') && ((int)uVar7 < iVar6)) {
      uVar4 = iVar3 + 2;
      switch(pcVar1[uVar7]) {
      case 'n':
        break;
      case 'o':
      case 'p':
      case 'q':
      case 's':
      case 'v':
      case 'w':
        break;
      case 'r':
        break;
      case 't':
        break;
      case 'u':
      case 'x':
        if ((int)uVar4 < iVar6) {
          iVar3 = (uint)(pcVar1[uVar7] != 'x') * 2 + 2;
          uVar2 = (long)(int)uVar4;
          do {
            uVar7 = uVar2;
            if ((iVar3 < 1) || ((long)iVar6 <= (long)uVar7)) break;
            iVar3 = iVar3 + -1;
            iVar5 = getHexitValue(this_00,pcVar1[uVar7]);
            uVar2 = uVar7 + 1;
          } while (-1 < iVar5);
          goto LAB_001fea1c;
        }
        break;
      default:
      }
      uVar7 = (ulong)uVar4;
    }
LAB_001fea1c:
    this_00 = (SelectionCompiler *)__return_storage_ptr__;
    std::__cxx11::string::append((ulong)__return_storage_ptr__,'\x01');
    iVar3 = (int)uVar7;
  } while( true );
}

Assistant:

std::string SelectionCompiler::getUnescapedStringLiteral() {
    /** @todo */
    std::string sb(cchToken - 2, ' ');

    int ichMax = ichToken + cchToken - 1;
    int ich    = ichToken + 1;

    while (ich < ichMax) {
      char ch = script[ich++];
      if (ch == '\\' && ich < ichMax) {
        ch = script[ich++];
        switch (ch) {
        case 'b':
          ch = '\b';
          break;
        case 'n':
          ch = '\n';
          break;
        case 't':
          ch = '\t';
          break;
        case 'r':
          ch = '\r';
          // fall into
        case '"':
        case '\\':
        case '\'':
          break;
        case 'x':
        case 'u':
          int digitCount = ch == 'x' ? 2 : 4;
          if (ich < ichMax) {
            int unicode = 0;
            for (int k = digitCount; --k >= 0 && ich < ichMax;) {
              char chT  = script[ich];
              int hexit = getHexitValue(chT);
              if (hexit < 0) break;
              unicode <<= 4;
              unicode += hexit;
              ++ich;
            }
            ch = (char)unicode;
          }
        }
      }
      sb.append(1, ch);
    }

    return sb;
  }